

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

bool __thiscall QWidgetWindowPrivate::treatAsVisible(QWidgetWindowPrivate *this)

{
  return (bool)(*(byte *)(*(long *)(*(long *)(*(long *)&this->field_0x8 + 0x30) + 0x20) + 9) >> 7);
}

Assistant:

void setVisible(bool visible) override
    {
        Q_Q(QWidgetWindow);
        qCDebug(lcWidgetShowHide) << "Setting visibility of" << q->widget()
               << "to" << visible << "via QWidgetWindowPrivate";

        if (QWidget *widget = q->widget()) {
            // If the widget's visible state is already matching the new QWindow
            // visible state we assume the widget has already synced up.
            if (visible != widget->isVisible())
                QWidgetPrivate::get(widget)->setVisible(visible);
        }

        // If we end up calling QWidgetPrivate::setVisible() above, we will
        // in most cases recurse back into setNativeWindowVisibility() to
        // update the QWindow state. But during QWidget::destroy() this is
        // not the case, as Qt::WA_WState_Created has been unset by the time
        // we check if we should call hide_helper(). We handle this case, as
        // well as the cases where we don't call QWidgetPrivate::setVisible(),
        // by syncing up the QWindow state here if needed.
        if (q->isVisible() != visible)
            QWindowPrivate::setVisible(visible);
    }